

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQHash sq_gethash(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectPtr *key;
  SQHash SVar1;
  
  key = stack_get(v,idx);
  SVar1 = HashObj(key);
  return SVar1;
}

Assistant:

SQHash sq_gethash(HSQUIRRELVM v, SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    return HashObj(o);
}